

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_935bd6::HandleStringsCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pcVar1;
  size_type sVar2;
  pointer pbVar3;
  bool bVar4;
  bool bVar5;
  uint j;
  BOM BVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  string *psVar11;
  undefined7 extraout_var;
  string *psVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint *puVar16;
  uint uVar17;
  ulong uVar18;
  pointer pbVar19;
  undefined4 uVar20;
  char cVar21;
  size_type sVar22;
  uint j_1;
  undefined4 uVar23;
  string_view value;
  BOM local_408;
  int limit_output;
  uint local_3f4;
  ulong local_3f0;
  string output;
  int limit_input;
  uint local_3b0;
  uint local_3ac;
  undefined8 local_3a8;
  undefined8 local_3a0;
  string s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  string fileName;
  RegularExpression regex;
  ifstream fin;
  uint auStack_218 [122];
  undefined4 uVar24;
  
  pbVar19 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar19) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fin,"STRINGS requires a file name and output variable",
               (allocator<char> *)&regex);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&fin);
    return false;
  }
  std::__cxx11::string::string((string *)&fileName,(string *)(pbVar19 + 1));
  bVar4 = cmsys::SystemTools::FileIsFullPath(&fileName);
  if (!bVar4) {
    psVar11 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
    _fin = psVar11->_M_string_length;
    regex.regmatch.startp[1] = (char *)(regex.regmatch.startp + 2);
    regex.regmatch.startp[0] = (char *)0x1;
    regex.regmatch.startp[2]._0_1_ = 0x2f;
    cmStrCat<std::__cxx11::string>
              (&s,(cmAlphaNum *)&fin,(cmAlphaNum *)&regex,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1);
    std::__cxx11::string::operator=((string *)&fileName,(string *)&s);
    std::__cxx11::string::~string((string *)&s);
  }
  pbVar19 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  limit_input = -1;
  limit_output = -1;
  regex.regmust = (char *)0x0;
  regex.program = (char *)0x0;
  psVar11 = pbVar19 + 2;
  regex.progsize = 0;
  memset(&regex,0,0xaa);
  bVar4 = true;
  local_408 = BOM_None;
  uVar20 = 0;
  local_3ac = 0;
  local_3f4 = 0;
  local_3a0 = (pointer)((ulong)local_3a0._4_4_ << 0x20);
  local_3a8 = (pointer)((ulong)local_3a8._4_4_ << 0x20);
  local_3b0 = 0;
  for (uVar13 = 3; pbVar3 = local_3a8,
      uVar13 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar19 >> 5);
      uVar13 = (ulong)((int)uVar13 + 1)) {
    bVar5 = std::operator==(pbVar19 + uVar13,"LIMIT_INPUT");
    if (bVar5) {
      uVar20 = 1;
      goto LAB_00279e25;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar13,"LIMIT_OUTPUT");
    if (bVar5) {
      uVar20 = 2;
      goto LAB_00279e25;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar13,"LIMIT_COUNT");
    if (bVar5) {
      uVar20 = 3;
      goto LAB_00279e25;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar13,"LENGTH_MINIMUM");
    if (bVar5) {
      uVar20 = 4;
      goto LAB_00279e25;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar13,"LENGTH_MAXIMUM");
    if (bVar5) {
      uVar20 = 5;
      goto LAB_00279e25;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar13,"REGEX");
    if (bVar5) {
      uVar20 = 7;
      goto LAB_00279e25;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar13,"NEWLINE_CONSUME");
    if (bVar5) {
      local_3ac = (uint)CONCAT71(extraout_var,1);
      uVar20 = 0;
      goto LAB_00279e25;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar13,"NO_HEX_CONVERSION")
    ;
    uVar24 = 0;
    uVar23 = 0;
    if (bVar5) {
      bVar4 = false;
      uVar20 = uVar24;
      goto LAB_00279e25;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar13,"ENCODING");
    if (bVar5) {
      uVar20 = 8;
      goto LAB_00279e25;
    }
    puVar16 = &switchD_00279eaa::switchdataD_005ce9d0;
    switch(uVar20) {
    case 1:
      iVar8 = __isoc99_sscanf((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar13]._M_dataplus._M_p,
                              "%d",&limit_input);
      if ((iVar8 != 1) || (uVar20 = 0, limit_input < 0)) {
        _fin = 0x22;
        pbVar19 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        s._M_string_length = (size_type)pbVar19[uVar13]._M_dataplus._M_p;
        s._M_dataplus._M_p = (pointer)pbVar19[uVar13]._M_string_length;
        cmStrCat<char[30]>(&output,(cmAlphaNum *)&fin,(cmAlphaNum *)&s,
                           (char (*) [30])"\" is not an unsigned integer.");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_0027aa61;
      }
      break;
    case 2:
      iVar8 = __isoc99_sscanf((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar13]._M_dataplus._M_p,
                              "%d",&limit_output);
      if ((iVar8 != 1) || (uVar20 = 0, limit_output < 0)) {
        _fin = 0x23;
        pbVar19 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        s._M_string_length = (size_type)pbVar19[uVar13]._M_dataplus._M_p;
        s._M_dataplus._M_p = (pointer)pbVar19[uVar13]._M_string_length;
        cmStrCat<char[30]>(&output,(cmAlphaNum *)&fin,(cmAlphaNum *)&s,
                           (char (*) [30])"\" is not an unsigned integer.");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_0027aa61;
      }
      break;
    case 3:
      iVar8 = __isoc99_sscanf((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar13]._M_dataplus._M_p,
                              "%d",&strings);
      if (iVar8 == 1) {
        local_3a0 = (pointer)CONCAT44(local_3a0._4_4_,
                                      (uint)strings.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
        uVar20 = uVar23;
        if (-1 < (int)(uint)strings.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) break;
      }
      _fin = 0x22;
      pbVar19 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      s._M_string_length = (size_type)pbVar19[uVar13]._M_dataplus._M_p;
      s._M_dataplus._M_p = (pointer)pbVar19[uVar13]._M_string_length;
      cmStrCat<char[30]>(&output,(cmAlphaNum *)&fin,(cmAlphaNum *)&s,
                         (char (*) [30])"\" is not an unsigned integer.");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_0027aa61;
    case 4:
      iVar8 = __isoc99_sscanf((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar13]._M_dataplus._M_p,
                              "%d",&strings);
      if (iVar8 == 1) {
        local_3b0 = (uint)strings.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        uVar20 = uVar23;
        if (-1 < (int)(uint)strings.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) break;
      }
      _fin = 0x25;
      pbVar19 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      s._M_string_length = (size_type)pbVar19[uVar13]._M_dataplus._M_p;
      s._M_dataplus._M_p = (pointer)pbVar19[uVar13]._M_string_length;
      cmStrCat<char[30]>(&output,(cmAlphaNum *)&fin,(cmAlphaNum *)&s,
                         (char (*) [30])"\" is not an unsigned integer.");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_0027aa61;
    case 5:
      iVar8 = __isoc99_sscanf((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar13]._M_dataplus._M_p,
                              "%d",&strings);
      if (iVar8 == 1) {
        local_3a8 = (pointer)CONCAT44(local_3a8._4_4_,
                                      (uint)strings.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
        uVar20 = uVar23;
        if (-1 < (int)(uint)strings.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) break;
      }
      _fin = 0x25;
      pbVar19 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      s._M_string_length = (size_type)pbVar19[uVar13]._M_dataplus._M_p;
      s._M_dataplus._M_p = (pointer)pbVar19[uVar13]._M_string_length;
      cmStrCat<char[30]>(&output,(cmAlphaNum *)&fin,(cmAlphaNum *)&s,
                         (char (*) [30])"\" is not an unsigned integer.");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_0027aa61;
    default:
      _fin = 0x20;
      pbVar19 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      s._M_string_length = (size_type)pbVar19[uVar13]._M_dataplus._M_p;
      s._M_dataplus._M_p = (pointer)pbVar19[uVar13]._M_string_length;
      cmStrCat<char[2]>(&output,(cmAlphaNum *)&fin,(cmAlphaNum *)&s,(char (*) [2])0x5eaac5);
      std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0027aa61:
      std::__cxx11::string::~string((string *)&output);
      bVar4 = false;
      goto LAB_0027a7be;
    case 7:
      bVar5 = cmsys::RegularExpression::compile
                        (&regex,(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar13);
      local_3f4 = (uint)CONCAT71((int7)((ulong)puVar16 >> 8),1);
      uVar20 = uVar23;
      if (!bVar5) {
        _fin = 0x1c;
        pbVar19 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        s._M_string_length = (size_type)pbVar19[uVar13]._M_dataplus._M_p;
        s._M_dataplus._M_p = (pointer)pbVar19[uVar13]._M_string_length;
        cmStrCat<char[25]>(&output,(cmAlphaNum *)&fin,(cmAlphaNum *)&s,
                           (char (*) [25])"\" could not be compiled.");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_0027aa61;
      }
      break;
    case 8:
      bVar5 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar13,"UTF-8");
      if (bVar5) {
        local_408 = BOM_UTF8;
        uVar20 = uVar24;
      }
      else {
        bVar5 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar13,"UTF-16LE");
        if (bVar5) {
          local_408 = BOM_UTF16LE;
          uVar20 = uVar24;
        }
        else {
          bVar5 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar13,"UTF-16BE");
          if (bVar5) {
            local_408 = BOM_UTF16BE;
            uVar20 = uVar24;
          }
          else {
            bVar5 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar13,"UTF-32LE");
            if (bVar5) {
              local_408 = BOM_UTF32LE;
              uVar20 = uVar24;
            }
            else {
              bVar5 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar13,"UTF-32BE"
                                     );
              local_408 = BOM_UTF32BE;
              uVar20 = uVar23;
              if (!bVar5) {
                _fin = 0x19;
                pbVar19 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                s._M_string_length = (size_type)pbVar19[uVar13]._M_dataplus._M_p;
                s._M_dataplus._M_p = (pointer)pbVar19[uVar13]._M_string_length;
                cmStrCat<char[18]>(&output,(cmAlphaNum *)&fin,(cmAlphaNum *)&s,
                                   (char (*) [18])"\" not recognized.");
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_0027aa61;
              }
            }
          }
        }
      }
    }
LAB_00279e25:
    pbVar19 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  }
  if (bVar4) {
    psVar12 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(status->Makefile);
    _fin = psVar12->_M_string_length;
    s._M_dataplus._M_p = &DAT_00000028;
    s._M_string_length = (size_type)anon_var_dwarf_954409;
    cmStrCat<>(&output,(cmAlphaNum *)&fin,(cmAlphaNum *)&s);
    bVar4 = cmHexFileConverter::TryConvert(&fileName,&output);
    if (bVar4) {
      std::__cxx11::string::_M_assign((string *)&fileName);
    }
    std::__cxx11::string::~string((string *)&output);
  }
  std::ifstream::ifstream(&fin,fileName._M_dataplus._M_p,_S_in);
  bVar4 = (*(byte *)((long)auStack_218 + *(long *)(_fin - 0x18)) & 5) == 0;
  if (!bVar4) {
    s._M_dataplus._M_p = (pointer)0xe;
    s._M_string_length = (size_type)anon_var_dwarf_954416;
    output._M_dataplus._M_p = (pointer)fileName._M_string_length;
    output._M_string_length = (size_type)fileName._M_dataplus._M_p;
    cmStrCat<char[18]>((string *)&strings,(cmAlphaNum *)&s,(cmAlphaNum *)&output,
                       (char (*) [18])"\" cannot be read.");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&strings);
    goto LAB_0027a7b1;
  }
  BVar6 = cmsys::FStream::ReadBOM((istream *)&fin);
  if (BVar6 == BOM_None) {
    BVar6 = local_408;
  }
  if (local_408 != BOM_None) {
    BVar6 = local_408;
  }
  uVar7 = 3;
  if ((BVar6 & ~BOM_UTF8) != BOM_UTF32BE) {
    uVar7 = (uint)((BVar6 & ~BOM_UTF8) == BOM_UTF16BE);
  }
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  s.field_2._M_local_buf[0] = '\0';
  uVar13 = (ulong)local_3a0 & 0xffffffff;
  uVar14 = (ulong)local_3b0;
  local_3f0 = 0;
  do {
    if (((int)local_3a0 != 0) &&
       (uVar15 = (long)strings.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)strings.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5, uVar13 <= uVar15))
    goto LAB_0027a667;
    if (((-1 < limit_input) && (iVar8 = std::istream::tellg(), limit_input <= iVar8)) ||
       ((*(byte *)((long)auStack_218 + *(long *)(_fin - 0x18)) & 5) != 0)) break;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    output._M_dataplus._M_p = (pointer)&output.field_2;
    uVar9 = std::istream::get();
    uVar17 = uVar7;
    while( true ) {
      bVar5 = uVar17 == 0;
      uVar17 = uVar17 - 1;
      cVar21 = (char)&fin;
      if (bVar5) break;
      uVar10 = std::istream::get();
      if ((*(byte *)((long)auStack_218 + *(long *)(_fin - 0x18)) & 5) != 0) {
        std::istream::putback(cVar21);
        break;
      }
      uVar9 = uVar9 << 8 | uVar10;
    }
    if (BVar6 == BOM_UTF32LE) {
      uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    }
    else if (BVar6 == BOM_UTF16LE) {
      uVar9 = (uint)(ushort)((ushort)uVar9 << 8 | (ushort)uVar9 >> 8);
    }
    if (uVar9 == 0xd) {
      bVar5 = false;
    }
    else {
      if (uVar9 < 0x100) {
        iVar8 = isprint(uVar9);
        if ((byte)(uVar9 == 10 & (byte)local_3ac | (uVar9 == 9 || iVar8 != 0)) != 1)
        goto LAB_0027a3c5;
        std::__cxx11::string::push_back((char)&output);
      }
      else {
LAB_0027a3c5:
        if (BVar6 == BOM_UTF8) {
          uVar18 = 0;
          for (uVar15 = 0; ((int)uVar18 == 0 && (uVar15 < 3)); uVar15 = uVar15 + 1) {
            if ((HandleStringsCommand::utf8_check_table[uVar15][0] & uVar9) ==
                (uint)HandleStringsCommand::utf8_check_table[uVar15][1]) {
              uVar18 = (ulong)((int)uVar15 + 2);
            }
            else {
              uVar18 = 0;
            }
          }
          for (iVar8 = 0; (int)uVar18 != iVar8; iVar8 = iVar8 + 1) {
            if ((iVar8 != 0) &&
               ((uVar9 = std::istream::get(), (uVar9 & 0xc0) != 0x80 ||
                ((*(uint *)((long)auStack_218 + *(long *)(_fin - 0x18)) & 5) != 0)))) {
              std::istream::putback(cVar21);
              break;
            }
            std::__cxx11::string::push_back((char)&output);
          }
          if (output._M_string_length != uVar18) {
            for (uVar17 = 0; (ulong)uVar17 < output._M_string_length - 1; uVar17 = uVar17 + 1) {
              std::istream::putback(cVar21);
            }
            output._M_string_length = 0;
            *output._M_dataplus._M_p = '\0';
          }
        }
      }
      if (uVar9 == 10 && (local_3ac & 1) == 0) {
        if ((s._M_string_length < uVar14) ||
           (((local_3f4 & 1) != 0 &&
            (bVar5 = cmsys::RegularExpression::find(&regex,s._M_dataplus._M_p), !bVar5)))) {
LAB_0027a5ab:
          s._M_string_length = 0;
          *s._M_dataplus._M_p = '\0';
          goto LAB_0027a5b9;
        }
        uVar17 = (int)local_3f0 + (int)s._M_string_length + 1;
        local_3f0 = (ulong)uVar17;
        if ((limit_output < 0) || (bVar5 = true, (int)uVar17 < limit_output)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&strings,&s);
          goto LAB_0027a5ab;
        }
      }
      else {
        if (output._M_string_length == 0) {
          if ((s._M_string_length != 0 && uVar14 <= s._M_string_length) &&
             (((local_3f4 & 1) == 0 ||
              (bVar5 = cmsys::RegularExpression::find(&regex,s._M_dataplus._M_p), bVar5)))) {
            uVar17 = (int)local_3f0 + (int)s._M_string_length + 1;
            local_3f0 = (ulong)uVar17;
            if ((-1 < limit_output) && (bVar5 = true, limit_output <= (int)uVar17))
            goto LAB_0027a62c;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&strings,&s);
          }
          goto LAB_0027a5ab;
        }
        std::__cxx11::string::append((string *)&s);
LAB_0027a5b9:
        bVar5 = false;
        if (((uint)local_3a8 == 0) || (s._M_string_length != ((ulong)pbVar3 & 0xffffffff)))
        goto LAB_0027a63a;
        if (local_3b0 <= (uint)local_3a8) {
          uVar17 = (uint)local_3a8;
          if ((local_3f4 & 1) != 0) {
            bVar5 = cmsys::RegularExpression::find(&regex,s._M_dataplus._M_p);
            if (!bVar5) goto LAB_0027a62a;
            uVar17 = (uint)s._M_string_length;
          }
          uVar17 = (int)local_3f0 + uVar17 + 1;
          local_3f0 = (ulong)uVar17;
          if ((-1 < limit_output) && (bVar5 = true, limit_output <= (int)uVar17)) goto LAB_0027a62c;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&strings,&s);
        }
LAB_0027a62a:
        bVar5 = false;
      }
LAB_0027a62c:
      s._M_string_length = 0;
      *s._M_dataplus._M_p = '\0';
    }
LAB_0027a63a:
    std::__cxx11::string::~string((string *)&output);
  } while (!bVar5);
  if ((int)local_3a0 == 0) {
    iVar8 = (int)local_3f0;
LAB_0027a685:
    if ((((s._M_string_length != 0) && (uVar14 <= s._M_string_length)) &&
        (((local_3f4 & 1) == 0 ||
         (bVar5 = cmsys::RegularExpression::find(&regex,s._M_dataplus._M_p), bVar5)))) &&
       ((limit_output < 0 || ((int)((uint)s._M_string_length + iVar8 + 1) < limit_output)))) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&strings,&s);
    }
  }
  else {
    uVar15 = (long)strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
LAB_0027a667:
    iVar8 = (int)local_3f0;
    if (uVar15 < uVar13) goto LAB_0027a685;
  }
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  local_3a8 = strings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  pbVar19 = strings.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while (pbVar19 != local_3a8) {
    std::__cxx11::string::append((char *)&output);
    pcVar1 = (pbVar19->_M_dataplus)._M_p;
    sVar2 = pbVar19->_M_string_length;
    local_3a0 = pbVar19;
    for (sVar22 = 0; sVar2 != sVar22; sVar22 = sVar22 + 1) {
      cVar21 = (char)&output;
      if (pcVar1[sVar22] == ';') {
        std::__cxx11::string::push_back(cVar21);
      }
      std::__cxx11::string::push_back(cVar21);
    }
    pbVar19 = local_3a0 + 1;
  }
  value._M_str = output._M_dataplus._M_p;
  value._M_len = output._M_string_length;
  cmMakefile::AddDefinition(status->Makefile,psVar11,value);
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::~string((string *)&s);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&strings);
LAB_0027a7b1:
  std::ifstream::~ifstream(&fin);
LAB_0027a7be:
  cmsys::RegularExpression::~RegularExpression(&regex);
  std::__cxx11::string::~string((string *)&fileName);
  return bVar4;
}

Assistant:

bool HandleStringsCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("STRINGS requires a file name and output variable");
    return false;
  }

  // Get the file to read.
  std::string fileName = args[1];
  if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
    fileName =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', args[1]);
  }

  // Get the variable in which to store the results.
  std::string const& outVar = args[2];

  // Parse the options.
  enum
  {
    arg_none,
    arg_limit_input,
    arg_limit_output,
    arg_limit_count,
    arg_length_minimum,
    arg_length_maximum,
    arg_maximum,
    arg_regex,
    arg_encoding
  };
  unsigned int minlen = 0;
  unsigned int maxlen = 0;
  int limit_input = -1;
  int limit_output = -1;
  unsigned int limit_count = 0;
  cmsys::RegularExpression regex;
  bool have_regex = false;
  bool newline_consume = false;
  bool hex_conversion_enabled = true;
  enum
  {
    encoding_none = cmsys::FStream::BOM_None,
    encoding_utf8 = cmsys::FStream::BOM_UTF8,
    encoding_utf16le = cmsys::FStream::BOM_UTF16LE,
    encoding_utf16be = cmsys::FStream::BOM_UTF16BE,
    encoding_utf32le = cmsys::FStream::BOM_UTF32LE,
    encoding_utf32be = cmsys::FStream::BOM_UTF32BE
  };
  int encoding = encoding_none;
  int arg_mode = arg_none;
  for (unsigned int i = 3; i < args.size(); ++i) {
    if (args[i] == "LIMIT_INPUT") {
      arg_mode = arg_limit_input;
    } else if (args[i] == "LIMIT_OUTPUT") {
      arg_mode = arg_limit_output;
    } else if (args[i] == "LIMIT_COUNT") {
      arg_mode = arg_limit_count;
    } else if (args[i] == "LENGTH_MINIMUM") {
      arg_mode = arg_length_minimum;
    } else if (args[i] == "LENGTH_MAXIMUM") {
      arg_mode = arg_length_maximum;
    } else if (args[i] == "REGEX") {
      arg_mode = arg_regex;
    } else if (args[i] == "NEWLINE_CONSUME") {
      newline_consume = true;
      arg_mode = arg_none;
    } else if (args[i] == "NO_HEX_CONVERSION") {
      hex_conversion_enabled = false;
      arg_mode = arg_none;
    } else if (args[i] == "ENCODING") {
      arg_mode = arg_encoding;
    } else if (arg_mode == arg_limit_input) {
      if (sscanf(args[i].c_str(), "%d", &limit_input) != 1 ||
          limit_input < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_INPUT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_output) {
      if (sscanf(args[i].c_str(), "%d", &limit_output) != 1 ||
          limit_output < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_OUTPUT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_count) {
      int count;
      if (sscanf(args[i].c_str(), "%d", &count) != 1 || count < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_COUNT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      limit_count = count;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_minimum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        status.SetError(cmStrCat("STRINGS option LENGTH_MINIMUM value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      minlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_maximum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        status.SetError(cmStrCat("STRINGS option LENGTH_MAXIMUM value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      maxlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_regex) {
      if (!regex.compile(args[i])) {
        status.SetError(cmStrCat("STRINGS option REGEX value \"", args[i],
                                 "\" could not be compiled."));
        return false;
      }
      have_regex = true;
      arg_mode = arg_none;
    } else if (arg_mode == arg_encoding) {
      if (args[i] == "UTF-8") {
        encoding = encoding_utf8;
      } else if (args[i] == "UTF-16LE") {
        encoding = encoding_utf16le;
      } else if (args[i] == "UTF-16BE") {
        encoding = encoding_utf16be;
      } else if (args[i] == "UTF-32LE") {
        encoding = encoding_utf32le;
      } else if (args[i] == "UTF-32BE") {
        encoding = encoding_utf32be;
      } else {
        status.SetError(cmStrCat("STRINGS option ENCODING \"", args[i],
                                 "\" not recognized."));
        return false;
      }
      arg_mode = arg_none;
    } else {
      status.SetError(
        cmStrCat("STRINGS given unknown argument \"", args[i], "\""));
      return false;
    }
  }

  if (hex_conversion_enabled) {
    // TODO: should work without temp file, but just on a memory buffer
    std::string binaryFileName =
      cmStrCat(status.GetMakefile().GetCurrentBinaryDirectory(),
               "/CMakeFiles/FileCommandStringsBinaryFile");
    if (cmHexFileConverter::TryConvert(fileName, binaryFileName)) {
      fileName = binaryFileName;
    }
  }

// Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(fileName.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(fileName.c_str());
#endif
  if (!fin) {
    status.SetError(
      cmStrCat("STRINGS file \"", fileName, "\" cannot be read."));
    return false;
  }

  // If BOM is found and encoding was not specified, use the BOM
  int bom_found = cmsys::FStream::ReadBOM(fin);
  if (encoding == encoding_none && bom_found != cmsys::FStream::BOM_None) {
    encoding = bom_found;
  }

  unsigned int bytes_rem = 0;
  if (encoding == encoding_utf16le || encoding == encoding_utf16be) {
    bytes_rem = 1;
  }
  if (encoding == encoding_utf32le || encoding == encoding_utf32be) {
    bytes_rem = 3;
  }

  // Parse strings out of the file.
  int output_size = 0;
  std::vector<std::string> strings;
  std::string s;
  while ((!limit_count || strings.size() < limit_count) &&
         (limit_input < 0 || static_cast<int>(fin.tellg()) < limit_input) &&
         fin) {
    std::string current_str;

    int c = fin.get();
    for (unsigned int i = 0; i < bytes_rem; ++i) {
      int c1 = fin.get();
      if (!fin) {
        fin.putback(static_cast<char>(c1));
        break;
      }
      c = (c << 8) | c1;
    }
    if (encoding == encoding_utf16le) {
      c = ((c & 0xFF) << 8) | ((c & 0xFF00) >> 8);
    } else if (encoding == encoding_utf32le) {
      c = (((c & 0xFF) << 24) | ((c & 0xFF00) << 8) | ((c & 0xFF0000) >> 8) |
           ((c & 0xFF000000) >> 24));
    }

    if (c == '\r') {
      // Ignore CR character to make output always have UNIX newlines.
      continue;
    }

    if (c >= 0 && c <= 0xFF &&
        (isprint(c) || c == '\t' || (c == '\n' && newline_consume))) {
      // This is an ASCII character that may be part of a string.
      // Cast added to avoid compiler warning. Cast is ok because
      // c is guaranteed to fit in char by the above if...
      current_str += static_cast<char>(c);
    } else if (encoding == encoding_utf8) {
      // Check for UTF-8 encoded string (up to 4 octets)
      static const unsigned char utf8_check_table[3][2] = {
        { 0xE0, 0xC0 },
        { 0xF0, 0xE0 },
        { 0xF8, 0xF0 },
      };

      // how many octets are there?
      unsigned int num_utf8_bytes = 0;
      for (unsigned int j = 0; num_utf8_bytes == 0 && j < 3; j++) {
        if ((c & utf8_check_table[j][0]) == utf8_check_table[j][1]) {
          num_utf8_bytes = j + 2;
        }
      }

      // get subsequent octets and check that they are valid
      for (unsigned int j = 0; j < num_utf8_bytes; j++) {
        if (j != 0) {
          c = fin.get();
          if (!fin || (c & 0xC0) != 0x80) {
            fin.putback(static_cast<char>(c));
            break;
          }
        }
        current_str += static_cast<char>(c);
      }

      // if this was an invalid utf8 sequence, discard the data, and put
      // back subsequent characters
      if ((current_str.length() != num_utf8_bytes)) {
        for (unsigned int j = 0; j < current_str.size() - 1; j++) {
          fin.putback(current_str[current_str.size() - 1 - j]);
        }
        current_str.clear();
      }
    }

    if (c == '\n' && !newline_consume) {
      // The current line has been terminated.  Check if the current
      // string matches the requirements.  The length may now be as
      // low as zero since blank lines are allowed.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else if (current_str.empty()) {
      // A non-string character has been found.  Check if the current
      // string matches the requirements.  We require that the length
      // be at least one no matter what the user specified.
      if (s.length() >= minlen && !s.empty() &&
          (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else {
      s += current_str;
    }

    if (maxlen > 0 && s.size() == maxlen) {
      // Terminate a string if the maximum length is reached.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }
      s.clear();
    }
  }

  // If there is a non-empty current string we have hit the end of the
  // input file or the input size limit.  Check if the current string
  // matches the requirements.
  if ((!limit_count || strings.size() < limit_count) && !s.empty() &&
      s.length() >= minlen && (!have_regex || regex.find(s))) {
    output_size += static_cast<int>(s.size()) + 1;
    if (limit_output < 0 || output_size < limit_output) {
      strings.push_back(s);
    }
  }

  // Encode the result in a CMake list.
  const char* sep = "";
  std::string output;
  for (std::string const& sr : strings) {
    // Separate the strings in the output to make it a list.
    output += sep;
    sep = ";";

    // Store the string in the output, but escape semicolons to
    // make sure it is a list.
    for (char i : sr) {
      if (i == ';') {
        output += '\\';
      }
      output += i;
    }
  }

  // Save the output in a makefile variable.
  status.GetMakefile().AddDefinition(outVar, output);
  return true;
}